

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

char * __thiscall
spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl(CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  SPIREntryPoint *pSVar4;
  bool bVar5;
  
  bVar3 = Bitset::get(flags,0x14eb);
  if (bVar3) {
    return "restrict ";
  }
  uVar1 = *(uint *)&(type->super_IVariant).field_0xc;
  if ((uVar1 < 0x13) && ((0x72180U >> (uVar1 & 0x1f) & 1) != 0)) {
    if ((this->options).es != true) {
      if ((this->backend).allow_precision_qualifiers != true) {
        return "";
      }
      if ((flags->lower & 1) != 0) {
        return "mediump ";
      }
      return "";
    }
    pSVar4 = Compiler::get_entry_point(&this->super_Compiler);
    iVar2 = *(int *)&(type->super_IVariant).field_0xc;
    if ((flags->lower & 1) != 0) {
      bVar3 = false;
      if ((iVar2 == 0xd) &&
         (bVar3 = false, (this->options).fragment.default_float_precision == Mediump)) {
        bVar3 = pSVar4->model == ExecutionModelFragment;
      }
      bVar5 = false;
      if ((iVar2 - 7U < 2) &&
         (bVar5 = false, (this->options).fragment.default_int_precision == Mediump)) {
        bVar5 = pSVar4->model == ExecutionModelFragment;
      }
      if (!(bool)(bVar3 | bVar5)) {
        return "mediump ";
      }
      return "";
    }
    if (iVar2 == 0xd) {
      if (pSVar4->model == ExecutionModelFragment &&
          (this->options).fragment.default_float_precision != Highp) {
        return "highp ";
      }
    }
    else {
      if (1 < iVar2 - 7U) {
        return "highp ";
      }
      if (pSVar4->model == ExecutionModelFragment &&
          (this->options).fragment.default_int_precision != Highp) {
        return "highp ";
      }
    }
  }
  return "";
}

Assistant:

const char *CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::Int && type.basetype != SPIRType::UInt &&
	    type.basetype != SPIRType::Image && type.basetype != SPIRType::SampledImage &&
	    type.basetype != SPIRType::Sampler)
		return "";

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			return implied_fmediump || implied_imediump ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			return implied_fhighp || implied_ihighp ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			return "mediump ";
		else
			return "";
	}
	else
		return "";
}